

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_do_button_text(nk_flags *state,nk_command_buffer *out,nk_rect bounds,char *string,int len
                         ,nk_flags align,nk_button_behavior behavior,nk_style_button *style,
                         nk_input *in,nk_user_font *font)

{
  nk_rect r;
  nk_flags in_ECX;
  long in_RDX;
  nk_rect *in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  nk_user_font *unaff_retaddr;
  long in_stack_00000008;
  int ret;
  nk_rect content;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb4;
  nk_style_button *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  int len_00;
  nk_flags text_alignment;
  undefined4 local_4;
  
  text_alignment = (nk_flags)((ulong)in_XMM1_Qa >> 0x20);
  len_00 = (int)((ulong)in_XMM0_Qa >> 0x20);
  fVar3 = (float)in_RDI;
  uVar4 = (undefined4)((ulong)in_RDI >> 0x20);
  uVar1 = (undefined4)in_RDX;
  uVar2 = (undefined4)((ulong)in_RDX >> 0x20);
  if ((((in_RSI == (nk_rect *)0x0) || (in_stack_00000008 == 0)) || (_ret == 0)) || (in_RDX == 0)) {
    local_4 = 0;
  }
  else {
    r._4_8_ = in_RSI;
    r.x = (float)uVar2;
    r.h = fVar3;
    local_4 = nk_do_button((nk_flags *)CONCAT44(in_ECX,in_R8D),
                           (nk_command_buffer *)CONCAT44(in_R9D,in_stack_ffffffffffffffc0),r,
                           in_stack_ffffffffffffffb8,
                           (nk_input *)((ulong)in_stack_ffffffffffffffb4 << 0x20),
                           (nk_button_behavior)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                           (nk_rect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
    ;
    if (*(long *)(in_stack_00000008 + 0xa0) != 0) {
      (**(code **)(in_stack_00000008 + 0xa0))(in_RSI,*(undefined8 *)(in_stack_00000008 + 0x98));
    }
    nk_draw_button_text((nk_command_buffer *)CONCAT44(uVar4,fVar3),in_RSI,
                        (nk_rect *)CONCAT44(uVar2,uVar1),in_ECX,
                        (nk_style_button *)CONCAT44(in_R9D,in_stack_ffffffffffffffc0),
                        (char *)in_stack_ffffffffffffffb8,len_00,text_alignment,unaff_retaddr);
    if (*(long *)(in_stack_00000008 + 0xa8) != 0) {
      (**(code **)(in_stack_00000008 + 0xa8))(in_RSI,*(undefined8 *)(in_stack_00000008 + 0x98));
    }
  }
  return local_4;
}

Assistant:

NK_LIB nk_bool
nk_do_button_text(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect bounds,
const char *string, int len, nk_flags align, enum nk_button_behavior behavior,
const struct nk_style_button *style, const struct nk_input *in,
const struct nk_user_font *font)
{
struct nk_rect content;
int ret = nk_false;

NK_ASSERT(state);
NK_ASSERT(style);
NK_ASSERT(out);
NK_ASSERT(string);
NK_ASSERT(font);
if (!out || !style || !font || !string)
return nk_false;

ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_button_text(out, &bounds, &content, *state, style, string, len, align, font);
if (style->draw_end) style->draw_end(out, style->userdata);
return ret;
}